

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_curse_combat(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  curse *curse;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"to-h");
    *(short *)(*(long *)((long)pvVar2 + 0x18) + 0x48) = (short)wVar1;
    wVar1 = parser_getint(p,"to-d");
    *(short *)(*(long *)((long)pvVar2 + 0x18) + 0x4a) = (short)wVar1;
    wVar1 = parser_getint(p,"to-a");
    *(short *)(*(long *)((long)pvVar2 + 0x18) + 0x46) = (short)wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_curse_combat(struct parser *p) {
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	curse->obj->to_h = parser_getint(p, "to-h");
	curse->obj->to_d = parser_getint(p, "to-d");
	curse->obj->to_a = parser_getint(p, "to-a");
	return PARSE_ERROR_NONE;
}